

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O0

insert_result __thiscall
tonk::LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
          (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this,uint *k,
          IConnection **v)

{
  bool bVar1;
  IConnection **in_RDX;
  uint *in_RSI;
  insert_result *in_RDI;
  uint newSize;
  insert_result result;
  uint in_stack_00000064;
  LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *in_stack_00000068;
  insert_result in_stack_fffffffffffffff8;
  
  std::pair<int,_bool>::pair<int,_bool,_true>((pair<int,_bool> *)&stack0xfffffffffffffff8);
  bVar1 = insert_no_grow((LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)
                         in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
  if (!bVar1) {
    rehash(in_stack_00000068,in_stack_00000064);
    insert_no_grow((LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *)
                   in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
  }
  return in_stack_fffffffffffffff8;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }